

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ActionBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ActionBlockSyntax,slang::syntax::StatementSyntax*&,slang::syntax::ElseClauseSyntax*&>
          (BumpAllocator *this,StatementSyntax **args,ElseClauseSyntax **args_1)

{
  ElseClauseSyntax *elseClause;
  StatementSyntax *in_RDX;
  ActionBlockSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  elseClause = (ElseClauseSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::ActionBlockSyntax::ActionBlockSyntax(in_RSI,in_RDX,elseClause);
  return (ActionBlockSyntax *)elseClause;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }